

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::~IfcFooting(IfcFooting *this)

{
  *(undefined8 *)&this[-1].field_0x48 = 0x8cd830;
  *(undefined8 *)&this->field_0x30 = 0x8cd948;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8cd858;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8cd880;
  *(undefined8 *)&this[-1].field_0x118 = 0x8cd8a8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8cd8d0;
  *(undefined8 *)&this[-1].field_0x180 = 0x8cd8f8;
  *(undefined8 *)this = 0x8cd920;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x48,&PTR_construction_vtable_24__008cd968);
  operator_delete(&this[-1].field_0x48,400);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}